

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall HEkk::initialiseSimplexLpRandomVectors(HEkk *this)

{
  HighsRandom *this_00;
  int N;
  int *piVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  vector<double,_std::allocator<double>_> *this_01;
  size_type __new_size;
  int N_00;
  ulong __new_size_00;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  N = (this->lp_).num_col_;
  __new_size = (size_type)N;
  __new_size_00 = (long)(this->lp_).num_row_ + __new_size;
  N_00 = (int)__new_size_00;
  if (N_00 != 0) {
    this_00 = &this->random_;
    if (N != 0) {
      std::vector<int,_std::allocator<int>_>::resize(&(this->info_).numColPermutation_,__new_size);
      auVar2 = _DAT_003beea0;
      piVar1 = (this->info_).numColPermutation_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (0 < N) {
        lVar7 = __new_size - 1;
        auVar5._8_4_ = (int)lVar7;
        auVar5._0_8_ = lVar7;
        auVar5._12_4_ = (int)((ulong)lVar7 >> 0x20);
        uVar3 = 0;
        auVar5 = auVar5 ^ _DAT_003beea0;
        auVar9 = _DAT_003bee90;
        do {
          auVar8 = auVar9 ^ auVar2;
          if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                      auVar5._4_4_ < auVar8._4_4_) & 1)) {
            piVar1[uVar3] = (int)uVar3;
          }
          if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
              auVar8._12_4_ <= auVar5._12_4_) {
            piVar1[uVar3 + 1] = (int)uVar3 + 1;
          }
          uVar3 = uVar3 + 2;
          lVar7 = auVar9._8_8_;
          auVar9._0_8_ = auVar9._0_8_ + 2;
          auVar9._8_8_ = lVar7 + 2;
        } while ((N + 1U & 0xfffffffe) != uVar3);
      }
      HighsRandom::shuffle<int>(this_00,piVar1,N);
    }
    std::vector<int,_std::allocator<int>_>::resize(&(this->info_).numTotPermutation_,__new_size_00);
    auVar2 = _DAT_003beea0;
    piVar1 = (this->info_).numTotPermutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < N_00) {
      lVar7 = (__new_size_00 & 0xffffffff) - 1;
      auVar6._8_4_ = (int)lVar7;
      auVar6._0_8_ = lVar7;
      auVar6._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar3 = 0;
      auVar6 = auVar6 ^ _DAT_003beea0;
      auVar8 = _DAT_003bee90;
      do {
        auVar9 = auVar8 ^ auVar2;
        if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                    auVar6._4_4_ < auVar9._4_4_) & 1)) {
          piVar1[uVar3] = (int)uVar3;
        }
        if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
            auVar9._12_4_ <= auVar6._12_4_) {
          piVar1[uVar3 + 1] = (int)uVar3 + 1;
        }
        uVar3 = uVar3 + 2;
        lVar7 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar7 + 2;
      } while ((N_00 + 1U & 0xfffffffe) != uVar3);
    }
    HighsRandom::shuffle<int>(this_00,piVar1,N_00);
    this_01 = &(this->info_).numTotRandomValue_;
    std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size_00);
    if (0 < N_00) {
      uVar3 = 0;
      do {
        dVar4 = HighsRandom::fraction(this_00);
        (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar3] = dVar4;
        uVar3 = uVar3 + 1;
      } while ((__new_size_00 & 0xffffffff) != uVar3);
    }
  }
  return;
}

Assistant:

void HEkk::initialiseSimplexLpRandomVectors() {
  const HighsInt num_col = lp_.num_col_;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  if (!num_tot) return;
  // Instantiate and (re-)initialise the random number generator
  //  HighsRandom random;
  HighsRandom& random = random_;
  //  random.initialise();

  if (num_col) {
    // Generate a random permutation of the column indices
    vector<HighsInt>& numColPermutation = info_.numColPermutation_;
    numColPermutation.resize(num_col);
    for (HighsInt i = 0; i < num_col; i++) numColPermutation[i] = i;
    random.shuffle(numColPermutation.data(), num_col);
  }

  // Re-initialise the random number generator and generate the
  // random vectors in the same order as hsol to maintain repeatable
  // performance
  // random.initialise();

  // Generate a random permutation of all the indices
  vector<HighsInt>& numTotPermutation = info_.numTotPermutation_;
  numTotPermutation.resize(num_tot);
  for (HighsInt i = 0; i < num_tot; i++) numTotPermutation[i] = i;
  random.shuffle(numTotPermutation.data(), num_tot);

  // Generate a vector of random reals
  info_.numTotRandomValue_.resize(num_tot);
  vector<double>& numTotRandomValue = info_.numTotRandomValue_;
  for (HighsInt i = 0; i < num_tot; i++) {
    numTotRandomValue[i] = random.fraction();
  }
}